

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

Client __thiscall
capnp::_::anon_unknown_0::TestRestorer::restore(TestRestorer *this,Reader objectId)

{
  ClientHook *extraout_RDX;
  ClientHook *pCVar1;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *extraout_RDX_04;
  long in_RSI;
  Client CVar2;
  StringPtr reason;
  Own<capnp::_::TestMoreStuffImpl> local_28;
  
  if (objectId._reader.dataSize < 0x10) {
switchD_00371fe8_caseD_0:
    kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_28,*(int **)(in_RSI + 8));
    Capability::Client::Client<capnp::_::TestInterfaceImpl,void>
              ((Client *)this,(Own<capnp::_::TestInterfaceImpl> *)&local_28);
    kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)&local_28);
    pCVar1 = extraout_RDX;
  }
  else {
    switch(*objectId._reader.data) {
    case 0:
      goto switchD_00371fe8_caseD_0;
    case 1:
      reason.content.size_ = (size_t)"No TestExtends implemented.";
      reason.content.ptr = (char *)&local_28;
      newBrokenCap(reason);
      (this->super_SturdyRefRestorer<capnproto_test::capnp::test::TestSturdyRefObjectId>).
      super_SturdyRefRestorerBase._vptr_SturdyRefRestorerBase = (_func_int **)local_28.disposer;
      *(TestMoreStuffImpl **)&this->callCount = local_28.ptr;
      local_28.ptr = (TestMoreStuffImpl *)0x0;
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_28);
      pCVar1 = extraout_RDX_00;
      break;
    case 2:
      kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&local_28,*(int **)(in_RSI + 8));
      Capability::Client::Client<capnp::_::TestPipelineImpl,void>
                ((Client *)this,(Own<capnp::_::TestPipelineImpl> *)&local_28);
      kj::Own<capnp::_::TestPipelineImpl>::dispose((Own<capnp::_::TestPipelineImpl> *)&local_28);
      pCVar1 = extraout_RDX_02;
      break;
    case 3:
      kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&local_28,*(int **)(in_RSI + 8));
      Capability::Client::Client<capnp::_::TestTailCalleeImpl,void>
                ((Client *)this,(Own<capnp::_::TestTailCalleeImpl> *)&local_28);
      kj::Own<capnp::_::TestTailCalleeImpl>::dispose((Own<capnp::_::TestTailCalleeImpl> *)&local_28)
      ;
      pCVar1 = extraout_RDX_03;
      break;
    case 4:
      kj::heap<capnp::_::TestTailCallerImpl,int&>((kj *)&local_28,*(int **)(in_RSI + 8));
      Capability::Client::Client<capnp::_::TestTailCallerImpl,void>
                ((Client *)this,(Own<capnp::_::TestTailCallerImpl> *)&local_28);
      kj::Own<capnp::_::TestTailCallerImpl>::dispose((Own<capnp::_::TestTailCallerImpl> *)&local_28)
      ;
      pCVar1 = extraout_RDX_01;
      break;
    case 5:
      kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
                ((kj *)&local_28,*(int **)(in_RSI + 8),*(int **)(in_RSI + 0x10));
      Capability::Client::Client<capnp::_::TestMoreStuffImpl,void>((Client *)this,&local_28);
      kj::Own<capnp::_::TestMoreStuffImpl>::dispose(&local_28);
      pCVar1 = extraout_RDX_04;
      break;
    default:
      kj::_::unreachable();
    }
  }
  CVar2.hook.ptr = pCVar1;
  CVar2.hook.disposer = (Disposer *)this;
  return (Client)CVar2.hook;
}

Assistant:

Capability::Client restore(test::TestSturdyRefObjectId::Reader objectId) override {
    switch (objectId.getTag()) {
      case test::TestSturdyRefObjectId::Tag::TEST_INTERFACE:
        return kj::heap<TestInterfaceImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_EXTENDS:
        return Capability::Client(newBrokenCap("No TestExtends implemented."));
      case test::TestSturdyRefObjectId::Tag::TEST_PIPELINE:
        return kj::heap<TestPipelineImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_TAIL_CALLEE:
        return kj::heap<TestTailCalleeImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_TAIL_CALLER:
        return kj::heap<TestTailCallerImpl>(callCount);
      case test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF:
        return kj::heap<TestMoreStuffImpl>(callCount, handleCount);
    }
    KJ_UNREACHABLE;
  }